

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void writeLZ77data(size_t *bp,ucvector *out,uivector *lz77_encoded,HuffmanTree *tree_ll,
                  HuffmanTree *tree_d)

{
  uint uVar1;
  HuffmanTree *in_RCX;
  long *in_RDX;
  ucvector *in_RSI;
  size_t *in_RDI;
  HuffmanTree *in_R8;
  uint distance_extra_bits;
  uint n_distance_extra_bits;
  uint distance_index;
  uint distance_code;
  uint length_extra_bits;
  uint n_length_extra_bits;
  uint length_index;
  uint val;
  size_t i;
  ucvector *in_stack_ffffffffffffff78;
  size_t *in_stack_ffffffffffffff80;
  ucvector *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  long local_30;
  
  for (local_30 = 0; local_30 != in_RDX[1]; local_30 = local_30 + 1) {
    uVar1 = *(uint *)(*in_RDX + local_30 * 4);
    HuffmanTree_getCode(in_RCX,uVar1);
    HuffmanTree_getLength(in_RCX,uVar1);
    addHuffmanSymbol(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0,0x125e59);
    if (0x100 < uVar1) {
      uVar1 = *(uint *)(*in_RDX + 4 + (local_30 + 1) * 4);
      local_30 = local_30 + 3;
      addBitsToStream((size_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88,(uint)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                      (size_t)in_stack_ffffffffffffff78);
      in_stack_ffffffffffffff80 = in_RDI;
      in_stack_ffffffffffffff88 = in_RSI;
      in_stack_ffffffffffffff94 = HuffmanTree_getCode(in_R8,uVar1);
      HuffmanTree_getLength(in_R8,uVar1);
      addHuffmanSymbol(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,0,0x125f6f);
      addBitsToStream((size_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                      in_stack_ffffffffffffff88,(uint)((ulong)in_stack_ffffffffffffff80 >> 0x20),
                      (size_t)in_stack_ffffffffffffff78);
    }
  }
  return;
}

Assistant:

static void writeLZ77data(size_t* bp, ucvector* out, const uivector* lz77_encoded,
	const HuffmanTree* tree_ll, const HuffmanTree* tree_d)
{
	size_t i = 0;
	for (i = 0; i != lz77_encoded->size; ++i)
	{
		unsigned val = lz77_encoded->data[i];
		addHuffmanSymbol(bp, out, HuffmanTree_getCode(tree_ll, val), HuffmanTree_getLength(tree_ll, val));
		if (val > 256) /*for a length code, 3 more things have to be added*/
		{
			unsigned length_index = val - FIRST_LENGTH_CODE_INDEX;
			unsigned n_length_extra_bits = LENGTHEXTRA[length_index];
			unsigned length_extra_bits = lz77_encoded->data[++i];

			unsigned distance_code = lz77_encoded->data[++i];

			unsigned distance_index = distance_code;
			unsigned n_distance_extra_bits = DISTANCEEXTRA[distance_index];
			unsigned distance_extra_bits = lz77_encoded->data[++i];

			addBitsToStream(bp, out, length_extra_bits, n_length_extra_bits);
			addHuffmanSymbol(bp, out, HuffmanTree_getCode(tree_d, distance_code),
				HuffmanTree_getLength(tree_d, distance_code));
			addBitsToStream(bp, out, distance_extra_bits, n_distance_extra_bits);
		}
	}
}